

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osEvent.cpp
# Opt level: O1

void osEvent::dump_info(ostream *out)

{
  long lVar1;
  osThread *this;
  long lVar2;
  size_t sVar3;
  char *__s;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"Event                         |Thread Name         |State\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"------------------------------+--------------------+------------\n",0x41);
  lVar4 = 0;
  do {
    lVar1 = *(long *)((long)InstanceList + lVar4);
    if (lVar1 != 0) {
      this = *(osThread **)(lVar1 + 0xb0);
      lVar2 = *(long *)out;
      *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 0x1e;
      lVar2 = *(long *)(lVar2 + -0x18);
      *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffff4f | 0x20;
      sVar3 = strlen((char *)(lVar1 + 0x59));
      std::__ostream_insert<char,std::char_traits<char>>(out,(char *)(lVar1 + 0x59),sVar3);
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0;
      std::__ostream_insert<char,std::char_traits<char>>(out,"|",1);
      lVar1 = *(long *)out;
      if (this == (osThread *)0x0) {
        *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 0x10) = 0x14;
        *(uint *)(out + *(long *)(lVar1 + -0x18) + 0x18) =
             *(uint *)(out + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffff4f | 0x20;
        __s = "";
        sVar3 = 0;
LAB_001098f3:
        std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar3);
      }
      else {
        *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 0x10) = 0x14;
        *(uint *)(out + *(long *)(lVar1 + -0x18) + 0x18) =
             *(uint *)(out + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffff4f | 0x20;
        __s = osThread::GetName(this);
        if (__s != (char *)0x0) {
          sVar3 = strlen(__s);
          goto LAB_001098f3;
        }
        std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
      }
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0;
      std::__ostream_insert<char,std::char_traits<char>>(out,"|",1);
      lVar1 = *(long *)out;
      *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 0x10) = 10;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(out + lVar1 + 0x18) = *(uint *)(out + lVar1 + 0x18) & 0xffffff4f | 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(out,"",0);
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0;
      std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
    }
    lVar4 = lVar4 + 8;
    if (lVar4 == 0xa0) {
      return;
    }
  } while( true );
}

Assistant:

void osEvent::dump_info(std::ostream& out)
{
    uint32_t i;

    out << "Event                         |Thread Name         |State\n";
    out << "------------------------------+--------------------+------------\n";
    for (i = 0; i < INSTANCE_MAX; i++)
    {
        osEvent* e = InstanceList[i];
        if (e)
        {
            osThread* thread = e->pending;
            out << std::setw(30) << std::left << e->GetName() << std::setw(0) << "|";
            if (thread)
            {
                out << std::setw(20) << std::left << thread->GetName() << std::setw(0) << "|";
                out << std::setw(10) << std::left << "" << std::setw(0) << "\n";
            }
            else
            {
                out << std::setw(20) << std::left << "" << std::setw(0) << "|";
                out << std::setw(10) << std::left << "" << std::setw(0) << "\n";
            }
        }
    }
}